

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaVirtualBlock_T::BuildStatsString(VmaVirtualBlock_T *this,bool detailedMap,VmaStringBuilder *sb)

{
  VmaJsonWriter json;
  VmaDetailedStatistics stats;
  VmaJsonWriter local_88;
  VmaDetailedStatistics local_58;
  
  local_88.m_Stack.m_Allocator.m_pCallbacks = &this->m_AllocationCallbacks;
  if (this->m_AllocationCallbacksSpecified == false) {
    local_88.m_Stack.m_Allocator.m_pCallbacks = (VkAllocationCallbacks *)0x0;
  }
  local_88.m_Stack.m_pArray = (StackItem *)0x0;
  local_88.m_Stack.m_Count._0_1_ = 0;
  local_88.m_Stack.m_Count._1_7_ = 0;
  local_88.m_Stack.m_Capacity._0_1_ = 0;
  local_88._33_8_ = 0;
  local_88.m_SB = sb;
  VmaJsonWriter::BeginObject(&local_88,false);
  CalculateDetailedStatistics(this,&local_58);
  VmaJsonWriter::WriteString(&local_88,"Stats");
  VmaPrintDetailedStatistics(&local_88,&local_58);
  if (detailedMap) {
    VmaJsonWriter::WriteString(&local_88,"Details");
    VmaJsonWriter::BeginObject(&local_88,false);
    (*this->m_Metadata->_vptr_VmaBlockMetadata[0x10])(this->m_Metadata,&local_88);
    VmaJsonWriter::EndObject(&local_88);
  }
  VmaJsonWriter::EndObject(&local_88);
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::~VmaVector
            (&local_88.m_Stack);
  return;
}

Assistant:

void VmaVirtualBlock_T::BuildStatsString(bool detailedMap, VmaStringBuilder& sb) const
{
    VmaJsonWriter json(GetAllocationCallbacks(), sb);
    json.BeginObject();

    VmaDetailedStatistics stats;
    CalculateDetailedStatistics(stats);

    json.WriteString("Stats");
    VmaPrintDetailedStatistics(json, stats);

    if (detailedMap)
    {
        json.WriteString("Details");
        json.BeginObject();
        m_Metadata->PrintDetailedMap(json);
        json.EndObject();
    }

    json.EndObject();
}